

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeInsertCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  int iVar1;
  int iCell;
  int nMaxCell;
  int nCell;
  RtreeCell *pCell_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  iVar1 = (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell;
  iCell = readInt16(pNode->zData + 2);
  if (iCell < iVar1) {
    nodeOverwriteCell(pRtree,pNode,pCell,iCell);
    writeInt16(pNode->zData + 2,iCell + 1);
    pNode->isDirty = 1;
  }
  return (int)(iCell == iVar1);
}

Assistant:

static int nodeInsertCell(
  Rtree *pRtree,                /* The overall R-Tree */
  RtreeNode *pNode,             /* Write new cell into this node */
  RtreeCell *pCell              /* The cell to be inserted */
){
  int nCell;                    /* Current number of cells in pNode */
  int nMaxCell;                 /* Maximum number of cells for pNode */

  nMaxCell = (pRtree->iNodeSize-4)/pRtree->nBytesPerCell;
  nCell = NCELL(pNode);

  assert( nCell<=nMaxCell );
  if( nCell<nMaxCell ){
    nodeOverwriteCell(pRtree, pNode, pCell, nCell);
    writeInt16(&pNode->zData[2], nCell+1);
    pNode->isDirty = 1;
  }

  return (nCell==nMaxCell);
}